

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

void __thiscall cbtDbvt::optimizeBottomUp(cbtDbvt *this)

{
  int iVar1;
  cbtDbvtNode **ppcVar2;
  long lVar3;
  tNodeArray leaves;
  tNodeArray tStack_38;
  
  if (this->m_root != (cbtDbvtNode *)0x0) {
    tStack_38.m_ownsMemory = true;
    tStack_38.m_data = (cbtDbvtNode **)0x0;
    tStack_38.m_size = 0;
    tStack_38.m_capacity = 0;
    iVar1 = this->m_leaves;
    if (0 < (long)iVar1) {
      ppcVar2 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar1 * 8,0x10);
      if (0 < (long)tStack_38.m_size) {
        lVar3 = 0;
        do {
          ppcVar2[lVar3] = tStack_38.m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (tStack_38.m_size != lVar3);
      }
      if ((tStack_38.m_data != (cbtDbvtNode **)0x0) && (tStack_38.m_ownsMemory == true)) {
        cbtAlignedFreeInternal(tStack_38.m_data);
      }
      tStack_38.m_capacity = iVar1;
      tStack_38.m_data = ppcVar2;
    }
    tStack_38.m_ownsMemory = true;
    fetchleaves(this,this->m_root,&tStack_38,-1);
    bottomup(this,tStack_38.m_data,tStack_38.m_size);
    this->m_root = *tStack_38.m_data;
    cbtAlignedObjectArray<cbtDbvtNode_*>::~cbtAlignedObjectArray(&tStack_38);
  }
  return;
}

Assistant:

void cbtDbvt::optimizeBottomUp()
{
	if (m_root)
	{
		tNodeArray leaves;
		leaves.reserve(m_leaves);
		fetchleaves(this, m_root, leaves);
		bottomup(this, &leaves[0], leaves.size());
		m_root = leaves[0];
	}
}